

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetMassFn(void *arkode_mem,ARKLsMassFn mass)

{
  int iVar1;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  ARKodeMem local_20;
  ARKLsMassMem local_18;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (mass == (ARKLsMassFn)0x0) {
      msgfmt = "Mass-matrix routine must be non-NULL";
    }
    else {
      if (local_18->M != (SUNMatrix)0x0) {
        local_18->mass = mass;
        local_18->M_data = local_20->user_data;
        return 0;
      }
      msgfmt = "Mass-matrix routine cannot be supplied for NULL SUNMatrix";
    }
    iVar1 = -3;
    arkProcessError(local_20,-3,"ARKLS","arkLSSetMassFn",msgfmt);
  }
  return iVar1;
}

Assistant:

int arkLSSetMassFn(void *arkode_mem, ARKLsMassFn mass)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassFn",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* return with failure if mass cannot be used */
  if (mass == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassFn",
                    "Mass-matrix routine must be non-NULL");
    return(ARKLS_ILL_INPUT);
  }
  if (arkls_mem->M == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassFn",
                    "Mass-matrix routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set mass matrix routine pointer and return */
  arkls_mem->mass   = mass;
  arkls_mem->M_data = ark_mem->user_data;

  return(ARKLS_SUCCESS);
}